

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PxVector.h
# Opt level: O3

void __thiscall hacd::vector<HACD::ChUll_*>::recreate(vector<HACD::ChUll_*> *this,HaU32 capacity)

{
  uint uVar1;
  long lVar2;
  ChUll **ppCVar3;
  long lVar4;
  ChUll **__src;
  
  if (capacity == 0) {
    __src = this->mData;
    if ((ulong)this->mSize == 0) {
      ppCVar3 = (ChUll **)0x0;
    }
    else {
      ppCVar3 = (ChUll **)0x0;
      memcpy((void *)0x0,__src,(ulong)this->mSize << 3);
    }
  }
  else {
    ppCVar3 = (ChUll **)malloc((ulong)capacity << 3);
    if ((ppCVar3 == (ChUll **)0x0) || (__src = this->mData, ppCVar3 == __src)) {
      __assert_fail("!capacity || newData && newData != mData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                    ,0x23b,"void hacd::vector<HACD::ChUll *>::recreate(HaU32) [T = HACD::ChUll *]");
    }
    uVar1 = this->mSize;
    if ((ulong)uVar1 != 0) {
      lVar4 = 0;
      do {
        lVar2 = lVar4 + 8;
        *(undefined8 *)((long)ppCVar3 + lVar4) = *(undefined8 *)((long)__src + lVar4);
        lVar4 = lVar4 + 8;
      } while ((ChUll **)((long)ppCVar3 + lVar2) < ppCVar3 + uVar1);
    }
  }
  if (-1 < (int)this->mCapacity) {
    free(__src);
  }
  this->mData = ppCVar3;
  this->mCapacity = capacity;
  return;
}

Assistant:

HACD_NOINLINE void vector<T>::recreate(HaU32 capacity)
	{
		T* newData = allocate(capacity);
		HACD_ASSERT(!capacity || newData && newData != mData);

		copy(newData, newData + mSize, mData);
		destroy(mData, mData + mSize);
		if(!isInUserMemory())
			deallocate(mData);

		mData = newData;
		mCapacity = capacity;
	}